

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

bool google::protobuf::compiler::objectivec::IsRetainedName(string *name)

{
  bool bVar1;
  int iVar2;
  allocator<char> local_2f;
  allocator<char> local_2e;
  allocator<char> local_2d [20];
  allocator<char> local_19;
  string *local_18;
  string *local_10;
  string *name_local;
  
  local_10 = name;
  if (IsRetainedName(std::__cxx11::string_const&)::retained_names_abi_cxx11_ == '\0') {
    iVar2 = __cxa_guard_acquire(&IsRetainedName(std::__cxx11::string_const&)::
                                 retained_names_abi_cxx11_);
    if (iVar2 != 0) {
      local_18 = IsRetainedName(std::__cxx11::string_const&)::retained_names_abi_cxx11_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)IsRetainedName(std::__cxx11::string_const&)::retained_names_abi_cxx11_,
                 "new",&local_19);
      local_18 = (string *)0x6fff60;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 (IsRetainedName(std::__cxx11::string_const&)::retained_names_abi_cxx11_ + 1),
                 "alloc",local_2d);
      local_18 = (string *)0x6fff80;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 (IsRetainedName(std::__cxx11::string_const&)::retained_names_abi_cxx11_ + 2),"copy"
                 ,&local_2e);
      local_18 = (string *)0x6fffa0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)
                 (IsRetainedName(std::__cxx11::string_const&)::retained_names_abi_cxx11_ + 3),
                 "mutableCopy",&local_2f);
      std::allocator<char>::~allocator(&local_2f);
      std::allocator<char>::~allocator(&local_2e);
      std::allocator<char>::~allocator(local_2d);
      std::allocator<char>::~allocator(&local_19);
      __cxa_atexit(__cxx_global_array_dtor,0,&__dso_handle);
      __cxa_guard_release(&IsRetainedName(std::__cxx11::string_const&)::retained_names_abi_cxx11_);
    }
  }
  bVar1 = anon_unknown_0::IsSpecialName
                    (local_10,IsRetainedName(std::__cxx11::string_const&)::retained_names_abi_cxx11_
                     ,4);
  return bVar1;
}

Assistant:

bool IsRetainedName(const string& name) {
  // List of prefixes from
  // http://developer.apple.com/library/mac/#documentation/Cocoa/Conceptual/MemoryMgmt/Articles/mmRules.html
  static const string retained_names[] = {"new", "alloc", "copy",
                                          "mutableCopy"};
  return IsSpecialName(name, retained_names,
                       sizeof(retained_names) / sizeof(retained_names[0]));
}